

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

int compare(void *arg1,void *arg2)

{
  PalEntry PVar1;
  PalEntry PVar2;
  
  PVar1.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[*arg1].field_0.d;
  PVar2.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[*arg2].field_0.d;
  return -(uint)(((uint)PVar1.field_0 & 0xff) * 0x72 + ((uint)PVar1.field_0 >> 8 & 0xff) * 0x24b +
                 ((uint)PVar1.field_0 >> 0x10 & 0xff) * 299 <
                ((uint)PVar2.field_0 & 0xff) * 0x72 + ((uint)PVar2.field_0 >> 8 & 0xff) * 0x24b +
                ((uint)PVar2.field_0 >> 0x10 & 0xff) * 299) | 1;
}

Assistant:

static int compare (const void *arg1, const void *arg2)
{
	if (RPART(GPalette.BaseColors[*((BYTE *)arg1)]) * 299 +
		GPART(GPalette.BaseColors[*((BYTE *)arg1)]) * 587 +
		BPART(GPalette.BaseColors[*((BYTE *)arg1)]) * 114  <
		RPART(GPalette.BaseColors[*((BYTE *)arg2)]) * 299 +
		GPART(GPalette.BaseColors[*((BYTE *)arg2)]) * 587 +
		BPART(GPalette.BaseColors[*((BYTE *)arg2)]) * 114)
		return -1;
	else
		return 1;
}